

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_prg.c
# Opt level: O3

void bashPrgSqueezeStep(void *buf,size_t count,void *state)

{
  octet *block;
  size_t count_00;
  ulong count_01;
  void *pvVar1;
  
  count_00 = *(long *)((long)state + 0xd0) - *(long *)((long)state + 0xd8);
  pvVar1 = (void *)((long)state + *(long *)((long)state + 0xd8) + 0x10);
  if (count < count_00) {
    memCopy(buf,pvVar1,count);
    *(long *)((long)state + 0xd8) = *(long *)((long)state + 0xd8) + count;
  }
  else {
    block = (octet *)((long)state + 0x10);
    memCopy(buf,pvVar1,count_00);
    pvVar1 = (void *)((long)buf + (*(long *)((long)state + 0xd0) - *(long *)((long)state + 0xd8)));
    count_01 = (count - *(long *)((long)state + 0xd0)) + *(long *)((long)state + 0xd8);
    while( true ) {
      bashF(block,(void *)((long)state + 0x1a0));
      if (count_01 < *(ulong *)((long)state + 0xd0)) break;
      memCopy(pvVar1,block,*(ulong *)((long)state + 0xd0));
      pvVar1 = (void *)((long)pvVar1 + *(long *)((long)state + 0xd0));
      count_01 = count_01 - *(long *)((long)state + 0xd0);
    }
    *(ulong *)((long)state + 0xd8) = count_01;
    if (count_01 != 0) {
      memCopy(pvVar1,block,count_01);
      return;
    }
  }
  return;
}

Assistant:

void bashPrgSqueezeStep(void* buf, size_t count, void* state)
{
	bash_prg_st* st = (bash_prg_st*)state;
	ASSERT(memIsDisjoint2(st, bashPrg_keep(), buf, count));
	// остатка буфера достаточно?
	if (count < st->buf_len - st->pos)
	{
		memCopy(buf, st->s + st->pos, count);
		st->pos += count;
		return;
	}
	// новый буфер
	memCopy(buf, st->s + st->pos, st->buf_len - st->pos);
	buf = (octet*)buf + st->buf_len - st->pos;
	count -= st->buf_len - st->pos;
	bashF(st->s, st->stack);
	// цикл по полным блокам
	while (count >= st->buf_len)
	{
		memCopy(buf, st->s, st->buf_len);
		buf = (octet*)buf + st->buf_len;
		count -= st->buf_len;
		bashF(st->s, st->stack);
	}
	// неполный блок
	if (st->pos = count)
		memCopy(buf, st->s, count);
}